

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int8_t msocket_connect(msocket_t *self,char *addr,uint16_t port)

{
  int8_t iVar1;
  int *piVar2;
  int local_34;
  int result;
  socklen_t sockoptlen;
  int sockoptval;
  uint16_t port_local;
  char *addr_local;
  msocket_t *self_local;
  
  sockoptlen._2_2_ = port;
  _sockoptval = addr;
  addr_local = (char *)self;
  if (((self == (msocket_t *)0x0) || (addr == (char *)0x0)) || ((self->socketMode & 2) != 0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    self_local._7_1_ = -1;
  }
  else {
    result = 1;
    if (self->handlerTable == (msocket_handler_t *)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0xe;
      self_local._7_1_ = -1;
    }
    else {
      if (self->addressFamily == '\n') {
        local_34 = msocket_connect_inet6(self,addr,port);
      }
      else {
        local_34 = msocket_connect_inet(self,addr,port);
      }
      if (local_34 < 0) {
        self_local._7_1_ = -1;
      }
      else {
        setsockopt(*(int *)addr_local,6,1,&result,4);
        addr_local[0xc2] = addr_local[0xc2] | 2;
        addr_local[0xc0] = '\x04';
        addr_local[0xc3] = '\x01';
        iVar1 = msocket_startIoThread((msocket_t *)addr_local);
        if (iVar1 < '\0') {
          close(*(int *)addr_local);
          addr_local[0xc0] = '\x06';
          self_local._7_1_ = -1;
        }
        else {
          self_local._7_1_ = '\0';
        }
      }
    }
  }
  return self_local._7_1_;
}

Assistant:

int8_t msocket_connect(msocket_t *self, const char *addr, uint16_t port){
   if( (self != 0) && (addr != 0) && ( (self->socketMode & MSOCKET_MODE_TCP) == 0) ) {
      int sockoptval = 1;
      socklen_t sockoptlen = sizeof(sockoptval);
      int result;
      if (self->handlerTable == 0) {
         errno = EFAULT;
         return -1;
      }
      result = (self->addressFamily == AF_INET6) ? msocket_connect_inet6(self, addr, port) : msocket_connect_inet(self, addr, port);
      if (result < 0) {
         return -1;
      }
      setsockopt(self->tcpsockfd, IPPROTO_TCP, TCP_NODELAY, (const char*)&sockoptval, sockoptlen);
      self->socketMode |= MSOCKET_MODE_TCP;
      self->state = MSOCKET_STATE_ESTABLISHED;
      self->newConnection = 1;
      result = msocket_startIoThread(self);
      if (result < 0) {
         SOCKET_CLOSE(self->tcpsockfd);
         self->state = MSOCKET_STATE_CLOSED;
         return -1;
      }
      return 0;
   }
   errno = EINVAL;
   return -1;
}